

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void HashmapRehashIntNode(jx9_hashmap_node *pEntry)

{
  jx9_hashmap *pjVar1;
  SyMemBackend *pSVar2;
  sxu32 sVar3;
  jx9_hashmap_node **ppjVar4;
  uint uVar5;
  jx9_hashmap_node *pjVar6;
  
  pjVar1 = pEntry->pMap;
  pjVar6 = pEntry->pNextCollide;
  if (pEntry->pPrevCollide == (jx9_hashmap_node *)0x0) {
    ppjVar4 = pjVar1->apBucket + (pjVar1->nSize - 1 & pEntry->nHash);
  }
  else {
    ppjVar4 = &pEntry->pPrevCollide->pNextCollide;
  }
  *ppjVar4 = pjVar6;
  if (pjVar6 != (jx9_hashmap_node *)0x0) {
    pjVar6->pPrevCollide = pEntry->pPrevCollide;
  }
  pEntry->pNextCollide = (jx9_hashmap_node *)0x0;
  pEntry->pPrevCollide = (jx9_hashmap_node *)0x0;
  sVar3 = (*pjVar1->xIntHash)(pjVar1->iNextIdx);
  pEntry->nHash = sVar3;
  pSVar2 = (SyMemBackend *)pjVar1->iNextIdx;
  (pEntry->xKey).sKey.pAllocator = pSVar2;
  uVar5 = pjVar1->nSize - 1 & sVar3;
  ppjVar4 = pjVar1->apBucket;
  pjVar6 = ppjVar4[uVar5];
  pEntry->pNextCollide = pjVar6;
  if (pjVar6 == (jx9_hashmap_node *)0x0) {
    pjVar6 = (jx9_hashmap_node *)0x0;
  }
  else {
    pjVar6->pPrevCollide = pEntry;
    pjVar6 = ppjVar4[uVar5];
  }
  pEntry->pNextCollide = pjVar6;
  ppjVar4[uVar5] = pEntry;
  pjVar1->iNextIdx = (sxi64)((long)&pSVar2->pMutexMethods + 1);
  return;
}

Assistant:

static void HashmapRehashIntNode(jx9_hashmap_node *pEntry)
{
	jx9_hashmap *pMap = pEntry->pMap;
	sxu32 nBucket;
	/* Remove old collision links */
	if( pEntry->pPrevCollide ){
		pEntry->pPrevCollide->pNextCollide = pEntry->pNextCollide;
	}else{
		pMap->apBucket[pEntry->nHash & (pMap->nSize - 1)] = pEntry->pNextCollide;
	}
	if( pEntry->pNextCollide ){
		pEntry->pNextCollide->pPrevCollide = pEntry->pPrevCollide;
	}
	pEntry->pNextCollide = pEntry->pPrevCollide = 0;
	/* Compute the new hash */
	pEntry->nHash = pMap->xIntHash(pMap->iNextIdx);
	pEntry->xKey.iKey = pMap->iNextIdx;
	nBucket = pEntry->nHash & (pMap->nSize - 1);
	/* Link to the new bucket */
	pEntry->pNextCollide = pMap->apBucket[nBucket];
	if( pMap->apBucket[nBucket] ){
		pMap->apBucket[nBucket]->pPrevCollide = pEntry;
	}
	pEntry->pNextCollide = pMap->apBucket[nBucket];
	pMap->apBucket[nBucket] = pEntry;
	/* Increment the automatic index */
	pMap->iNextIdx++;
}